

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint uVar18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  uint uVar24;
  ulong *puVar25;
  long lVar26;
  ulong uVar27;
  RTCRayQueryContext *pRVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  RTCIntersectArguments *pRVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar57 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1304;
  RTCFilterFunctionNArguments local_1300;
  RTCIntersectArguments *local_12d0;
  long local_12c8;
  long local_12c0;
  ulong local_12b8;
  float local_12b0;
  undefined4 local_12ac;
  undefined4 local_12a8;
  undefined4 local_12a4;
  undefined4 local_12a0;
  undefined4 local_129c;
  uint local_1298;
  uint local_1294;
  uint local_1290;
  undefined1 local_1280 [32];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [32];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  uint uStack_10c4;
  byte local_10c0;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  uint uStack_1024;
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  uint uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  uint uStack_fe4;
  undefined1 local_fe0;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  ulong local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  undefined1 auVar40 [16];
  
  local_fa0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 == 8) {
    return;
  }
  puVar25 = local_f90;
  aVar1 = (ray->super_RayK<1>).dir.field_0;
  auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar38 = vandps_avx512vl((undefined1  [16])aVar1,auVar38);
  auVar39._8_4_ = 0x219392ef;
  auVar39._0_8_ = 0x219392ef219392ef;
  auVar39._12_4_ = 0x219392ef;
  uVar32 = vcmpps_avx512vl(auVar38,auVar39,1);
  auVar92._8_4_ = 0x3f800000;
  auVar92._0_8_ = 0x3f8000003f800000;
  auVar92._12_4_ = 0x3f800000;
  uStack_f98 = 0;
  auVar38 = vdivps_avx(auVar92,(undefined1  [16])aVar1);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
  bVar9 = (bool)((byte)uVar32 & 1);
  auVar40._0_4_ = (uint)bVar9 * auVar39._0_4_ | (uint)!bVar9 * auVar38._0_4_;
  bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar38._4_4_;
  bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * auVar38._8_4_;
  bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * auVar38._12_4_;
  auVar41._8_4_ = 0x3f7ffffa;
  auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar41._12_4_ = 0x3f7ffffa;
  auVar41 = vmulps_avx512vl(auVar40,auVar41);
  auVar42._8_4_ = 0x3f800003;
  auVar42._0_8_ = 0x3f8000033f800003;
  auVar42._12_4_ = 0x3f800003;
  auVar42 = vmulps_avx512vl(auVar40,auVar42);
  uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_11d0._4_4_ = uVar89;
  local_11d0._0_4_ = uVar89;
  local_11d0._8_4_ = uVar89;
  local_11d0._12_4_ = uVar89;
  auVar97 = ZEXT1664(local_11d0);
  uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_11e0._4_4_ = uVar89;
  local_11e0._0_4_ = uVar89;
  local_11e0._8_4_ = uVar89;
  local_11e0._12_4_ = uVar89;
  auVar99 = ZEXT1664(local_11e0);
  uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_11f0._4_4_ = uVar89;
  local_11f0._0_4_ = uVar89;
  local_11f0._8_4_ = uVar89;
  local_11f0._12_4_ = uVar89;
  auVar100 = ZEXT1664(local_11f0);
  fVar91 = auVar41._0_4_;
  auVar38 = vmovshdup_avx(auVar41);
  local_1210 = vshufps_avx(auVar41,auVar41,0x55);
  auVar104 = ZEXT1664(local_1210);
  auVar39 = vshufpd_avx(auVar41,auVar41,1);
  local_1220 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar105 = ZEXT1664(local_1220);
  fVar81 = auVar42._0_4_;
  local_1240 = vshufps_avx512vl(auVar42,auVar42,0x55);
  auVar109 = ZEXT1664(local_1240);
  local_1250 = vshufps_avx512vl(auVar42,auVar42,0xaa);
  auVar110 = ZEXT1664(local_1250);
  uVar35 = (ulong)(fVar91 < 0.0) * 0x10;
  uVar32 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
  uVar36 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x40;
  local_12b8 = uVar35 ^ 0x10;
  local_1260 = vbroadcastss_avx512vl(auVar43);
  auVar111 = ZEXT1664(local_1260);
  uVar89 = auVar44._0_4_;
  auVar83 = ZEXT1664(CONCAT412(uVar89,CONCAT48(uVar89,CONCAT44(uVar89,uVar89))));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar112 = ZEXT3264(auVar57);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar113 = ZEXT3264(auVar57);
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar114 = ZEXT3264(auVar57);
  local_1200 = fVar91;
  fStack_11fc = fVar91;
  fStack_11f8 = fVar91;
  fStack_11f4 = fVar91;
  local_1230 = fVar81;
  fStack_122c = fVar81;
  fStack_1228 = fVar81;
  fStack_1224 = fVar81;
  fVar101 = fVar91;
  fVar102 = fVar91;
  fVar103 = fVar91;
  fVar106 = fVar81;
  fVar107 = fVar81;
  fVar108 = fVar81;
LAB_01ead31f:
  while (pfVar4 = (float *)(puVar25 + -1), puVar25 = puVar25 + -2,
        *pfVar4 <= (ray->super_RayK<1>).tfar) {
    uVar30 = *puVar25;
    while( true ) {
      if ((uVar30 & 8) != 0) {
        local_12c8 = (ulong)((uint)uVar30 & 0xf) - 8;
        if (local_12c8 == 0) goto LAB_01eadf63;
        uVar30 = uVar30 & 0xfffffffffffffff0;
        pSVar2 = context->scene;
        local_12c0 = 0;
        goto LAB_01ead617;
      }
      auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar35),auVar97._0_16_);
      auVar43._0_4_ = fVar91 * auVar38._0_4_;
      auVar43._4_4_ = fVar101 * auVar38._4_4_;
      auVar43._8_4_ = fVar102 * auVar38._8_4_;
      auVar43._12_4_ = fVar103 * auVar38._12_4_;
      auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar32),auVar99._0_16_);
      auVar44._0_4_ = auVar104._0_4_ * auVar38._0_4_;
      auVar44._4_4_ = auVar104._4_4_ * auVar38._4_4_;
      auVar44._8_4_ = auVar104._8_4_ * auVar38._8_4_;
      auVar44._12_4_ = auVar104._12_4_ * auVar38._12_4_;
      auVar38 = vmaxps_avx(auVar43,auVar44);
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + uVar36),auVar100._0_16_);
      auVar85._0_4_ = auVar105._0_4_ * auVar43._0_4_;
      auVar85._4_4_ = auVar105._4_4_ * auVar43._4_4_;
      auVar85._8_4_ = auVar105._8_4_ * auVar43._8_4_;
      auVar85._12_4_ = auVar105._12_4_ * auVar43._12_4_;
      auVar43 = vmaxps_avx512vl(auVar85,auVar111._0_16_);
      auVar38 = vmaxps_avx(auVar38,auVar43);
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + local_12b8),auVar97._0_16_);
      auVar86._0_4_ = fVar81 * auVar43._0_4_;
      auVar86._4_4_ = fVar106 * auVar43._4_4_;
      auVar86._8_4_ = fVar107 * auVar43._8_4_;
      auVar86._12_4_ = fVar108 * auVar43._12_4_;
      auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + (uVar32 ^ 0x10)),auVar99._0_16_);
      auVar43 = vmulps_avx512vl(auVar109._0_16_,auVar43);
      auVar43 = vminps_avx(auVar86,auVar43);
      auVar44 = vsubps_avx(*(undefined1 (*) [16])(uVar30 + 0x20 + (uVar36 ^ 0x10)),auVar100._0_16_);
      auVar44 = vmulps_avx512vl(auVar110._0_16_,auVar44);
      auVar44 = vminps_avx(auVar44,auVar83._0_16_);
      auVar43 = vminps_avx(auVar43,auVar44);
      uVar37 = vcmpps_avx512vl(auVar38,auVar43,2);
      local_1180._0_16_ = auVar38;
      if ((char)uVar37 == '\0') break;
      uVar27 = uVar30 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar30 = uVar37; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar30 = *(ulong *)(uVar27 + lVar19 * 8);
      uVar29 = (uint)uVar37 - 1 & (uint)uVar37;
      uVar37 = (ulong)uVar29;
      if (uVar29 != 0) {
        uVar33 = *(uint *)(local_1180 + lVar19 * 4);
        lVar19 = 0;
        for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar19 = lVar19 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar31 = (ulong)uVar29;
        uVar37 = *(ulong *)(uVar27 + lVar19 * 8);
        uVar18 = *(uint *)(local_1180 + lVar19 * 4);
        if (uVar29 == 0) {
          if (uVar33 < uVar18) {
            *puVar25 = uVar37;
            *(uint *)(puVar25 + 1) = uVar18;
            puVar25 = puVar25 + 2;
          }
          else {
            *puVar25 = uVar30;
            *(uint *)(puVar25 + 1) = uVar33;
            puVar25 = puVar25 + 2;
            uVar30 = uVar37;
          }
        }
        else {
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar30;
          auVar38 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar33));
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar37;
          auVar43 = vpunpcklqdq_avx(auVar87,ZEXT416(uVar18));
          lVar19 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar30 = (ulong)uVar29;
          auVar88._8_8_ = 0;
          auVar88._0_8_ = *(ulong *)(uVar27 + lVar19 * 8);
          auVar42 = vpunpcklqdq_avx(auVar88,ZEXT416(*(uint *)(local_1180 + lVar19 * 4)));
          auVar44 = vpshufd_avx(auVar38,0xaa);
          auVar39 = vpshufd_avx(auVar43,0xaa);
          auVar41 = vpshufd_avx(auVar42,0xaa);
          if (uVar29 == 0) {
            uVar30 = vpcmpgtd_avx512vl(auVar39,auVar44);
            uVar30 = uVar30 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar43,auVar38);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar45._0_4_ = (uint)bVar9 * auVar39._0_4_ | (uint)!bVar9 * auVar44._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar44._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * auVar44._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar45._12_4_ = (uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * auVar44._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar46._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar38._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar38._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar38._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar46._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar38._12_4_;
            auVar38 = vpshufd_avx(auVar45,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar41,auVar38);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar42,auVar45);
            bVar9 = (bool)((byte)uVar37 & 1);
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar30 = CONCAT44((uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar38._4_4_,
                              (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar38._0_4_);
            auVar38 = vmovdqa32_avx512vl(auVar42);
            bVar9 = (bool)((byte)uVar37 & 1);
            auVar47._0_4_ = (uint)bVar9 * auVar38._0_4_ | !bVar9 * auVar45._0_4_;
            bVar9 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar9 * auVar38._4_4_ | !bVar9 * auVar45._4_4_;
            bVar9 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar9 * auVar38._8_4_ | !bVar9 * auVar45._8_4_;
            bVar9 = SUB81(uVar37 >> 3,0);
            auVar47._12_4_ = (uint)bVar9 * auVar38._12_4_ | !bVar9 * auVar45._12_4_;
            auVar38 = vpshufd_avx(auVar47,0xaa);
            auVar43 = vpshufd_avx(auVar46,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar38,auVar43);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar47,auVar46);
            bVar9 = (bool)((byte)uVar37 & 1);
            auVar48._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar38._0_4_;
            bVar9 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar38._4_4_;
            bVar9 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar38._8_4_;
            bVar9 = SUB81(uVar37 >> 3,0);
            auVar48._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar38._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar47);
            bVar9 = (bool)((byte)uVar37 & 1);
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar37 >> 2) & 1);
            bVar13 = SUB81(uVar37 >> 3,0);
            *(uint *)puVar25 = (uint)bVar9 * auVar38._0_4_ | !bVar9 * auVar46._0_4_;
            *(uint *)((long)puVar25 + 4) = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar46._4_4_;
            *(uint *)(puVar25 + 1) = (uint)bVar11 * auVar38._8_4_ | !bVar11 * auVar46._8_4_;
            *(uint *)((long)puVar25 + 0xc) =
                 (uint)bVar13 * auVar38._12_4_ | !bVar13 * auVar46._12_4_;
            *(undefined1 (*) [16])(puVar25 + 2) = auVar48;
            puVar25 = puVar25 + 4;
          }
          else {
            lVar19 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar29 = *(uint *)(local_1180 + lVar19 * 4);
            auVar94._8_8_ = 0;
            auVar94._0_8_ = *(ulong *)(uVar27 + lVar19 * 8);
            auVar40 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar29));
            uVar30 = vpcmpgtd_avx512vl(auVar39,auVar44);
            uVar30 = uVar30 & 0xf;
            auVar39 = vpblendmd_avx512vl(auVar43,auVar38);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar49._0_4_ = (uint)bVar9 * auVar39._0_4_ | (uint)!bVar9 * auVar44._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar44._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * auVar44._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar49._12_4_ = (uint)bVar9 * auVar39._12_4_ | (uint)!bVar9 * auVar44._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar50._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar38._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar38._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar38._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar50._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar38._12_4_;
            auVar90._4_4_ = uVar29;
            auVar90._0_4_ = uVar29;
            auVar90._8_4_ = uVar29;
            auVar90._12_4_ = uVar29;
            uVar30 = vpcmpgtd_avx512vl(auVar90,auVar41);
            uVar30 = uVar30 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar40,auVar42);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar51._0_4_ = (uint)bVar9 * auVar38._0_4_ | !bVar9 * uVar29;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar9 * auVar38._4_4_ | !bVar9 * uVar29;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar9 * auVar38._8_4_ | !bVar9 * uVar29;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar51._12_4_ = (uint)bVar9 * auVar38._12_4_ | !bVar9 * uVar29;
            auVar38 = vmovdqa32_avx512vl(auVar40);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar52._0_4_ = (uint)bVar9 * auVar38._0_4_ | (uint)!bVar9 * auVar42._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar9 * auVar38._4_4_ | (uint)!bVar9 * auVar42._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar9 * auVar38._8_4_ | (uint)!bVar9 * auVar42._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar52._12_4_ = (uint)bVar9 * auVar38._12_4_ | (uint)!bVar9 * auVar42._12_4_;
            auVar38 = vpshufd_avx(auVar52,0xaa);
            auVar43 = vpshufd_avx(auVar50,0xaa);
            uVar30 = vpcmpgtd_avx512vl(auVar38,auVar43);
            uVar30 = uVar30 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar52,auVar50);
            bVar9 = (bool)((byte)uVar30 & 1);
            auVar53._0_4_ = (uint)bVar9 * auVar43._0_4_ | (uint)!bVar9 * auVar38._0_4_;
            bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar9 * auVar43._4_4_ | (uint)!bVar9 * auVar38._4_4_;
            bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar9 * auVar43._8_4_ | (uint)!bVar9 * auVar38._8_4_;
            bVar9 = SUB81(uVar30 >> 3,0);
            auVar53._12_4_ = (uint)bVar9 * auVar43._12_4_ | (uint)!bVar9 * auVar38._12_4_;
            auVar44 = vmovdqa32_avx512vl(auVar52);
            bVar9 = (bool)((byte)uVar30 & 1);
            bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
            bVar14 = SUB81(uVar30 >> 3,0);
            auVar38 = vpshufd_avx(auVar51,0xaa);
            auVar43 = vpshufd_avx(auVar49,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar38,auVar43);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar51,auVar49);
            bVar10 = (bool)((byte)uVar37 & 1);
            bVar13 = (bool)((byte)(uVar37 >> 1) & 1);
            uVar30 = CONCAT44((uint)bVar13 * auVar43._4_4_ | (uint)!bVar13 * auVar38._4_4_,
                              (uint)bVar10 * auVar43._0_4_ | (uint)!bVar10 * auVar38._0_4_);
            auVar38 = vmovdqa32_avx512vl(auVar51);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar54._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar49._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar54._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar49._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar54._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar49._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar54._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar49._12_4_;
            auVar38 = vpshufd_avx(auVar54,0xaa);
            auVar43 = vpshufd_avx(auVar53,0xaa);
            uVar37 = vpcmpgtd_avx512vl(auVar43,auVar38);
            uVar37 = uVar37 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar53,auVar54);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar55._0_4_ = (uint)bVar10 * auVar43._0_4_ | (uint)!bVar10 * auVar38._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar55._4_4_ = (uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar38._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar55._8_4_ = (uint)bVar10 * auVar43._8_4_ | (uint)!bVar10 * auVar38._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar55._12_4_ = (uint)bVar10 * auVar43._12_4_ | (uint)!bVar10 * auVar38._12_4_;
            auVar38 = vmovdqa32_avx512vl(auVar53);
            bVar10 = (bool)((byte)uVar37 & 1);
            auVar56._0_4_ = (uint)bVar10 * auVar38._0_4_ | !bVar10 * auVar54._0_4_;
            bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar10 * auVar38._4_4_ | !bVar10 * auVar54._4_4_;
            bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar54._8_4_;
            bVar10 = SUB81(uVar37 >> 3,0);
            auVar56._12_4_ = (uint)bVar10 * auVar38._12_4_ | !bVar10 * auVar54._12_4_;
            *(uint *)puVar25 = (uint)bVar9 * auVar44._0_4_ | !bVar9 * auVar50._0_4_;
            *(uint *)((long)puVar25 + 4) = (uint)bVar11 * auVar44._4_4_ | !bVar11 * auVar50._4_4_;
            *(uint *)(puVar25 + 1) = (uint)bVar12 * auVar44._8_4_ | !bVar12 * auVar50._8_4_;
            *(uint *)((long)puVar25 + 0xc) =
                 (uint)bVar14 * auVar44._12_4_ | !bVar14 * auVar50._12_4_;
            *(undefined1 (*) [16])(puVar25 + 2) = auVar56;
            *(undefined1 (*) [16])(puVar25 + 4) = auVar55;
            puVar25 = puVar25 + 6;
          }
        }
      }
    }
    if (puVar25 == &local_fa0) {
      return;
    }
  }
  goto LAB_01eadfc0;
LAB_01ead617:
  do {
    lVar26 = local_12c0 * 0x60;
    ppfVar3 = (pSVar2->vertices).items;
    pfVar4 = ppfVar3[*(uint *)(uVar30 + 0x48 + lVar26)];
    auVar79._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 0x28 + lVar26));
    auVar79._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 8 + lVar26));
    pfVar5 = ppfVar3[*(uint *)(uVar30 + 0x40 + lVar26)];
    auVar60._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + 0x20 + lVar26));
    auVar60._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + lVar26));
    pfVar6 = ppfVar3[*(uint *)(uVar30 + 0x4c + lVar26)];
    auVar61._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0x2c + lVar26));
    auVar61._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0xc + lVar26));
    pfVar7 = ppfVar3[*(uint *)(uVar30 + 0x44 + lVar26)];
    auVar67._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x24 + lVar26));
    auVar67._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 4 + lVar26));
    lVar19 = uVar30 + 0x40 + lVar26;
    local_fc0 = *(undefined8 *)(lVar19 + 0x10);
    uStack_fb8 = *(undefined8 *)(lVar19 + 0x18);
    uStack_fb0 = local_fc0;
    uStack_fa8 = uStack_fb8;
    lVar19 = uVar30 + 0x50 + lVar26;
    local_11a0 = *(undefined8 *)(lVar19 + 0x10);
    uStack_1198 = *(undefined8 *)(lVar19 + 0x18);
    auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + 0x10 + lVar26)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 0x18 + lVar26)));
    auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + 0x10 + lVar26)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 0x18 + lVar26)));
    auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x14 + lVar26)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0x1c + lVar26)));
    auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x14 + lVar26)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0x1c + lVar26)));
    auVar41 = vunpcklps_avx(auVar38,auVar43);
    auVar42 = vunpcklps_avx(auVar44,auVar39);
    auVar38 = vunpckhps_avx(auVar44,auVar39);
    auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + 0x30 + lVar26)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 0x38 + lVar26)));
    auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar30 + 0x30 + lVar26)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar30 + 0x38 + lVar26)));
    auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x34 + lVar26)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0x3c + lVar26)));
    auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar30 + 0x34 + lVar26)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar30 + 0x3c + lVar26)));
    auVar44 = vunpcklps_avx(auVar43,auVar44);
    auVar92 = vunpcklps_avx(auVar39,auVar40);
    auVar43 = vunpckhps_avx(auVar39,auVar40);
    uStack_1190 = local_11a0;
    uStack_1188 = uStack_1198;
    auVar57 = vunpcklps_avx(auVar67,auVar61);
    auVar77 = vunpcklps_avx(auVar60,auVar79);
    auVar78 = vunpcklps_avx(auVar77,auVar57);
    auVar77 = vunpckhps_avx(auVar77,auVar57);
    auVar57 = vunpckhps_avx(auVar67,auVar61);
    auVar79 = vunpckhps_avx(auVar60,auVar79);
    auVar79 = vunpcklps_avx(auVar79,auVar57);
    auVar63._16_16_ = auVar42;
    auVar63._0_16_ = auVar42;
    auVar68._16_16_ = auVar38;
    auVar68._0_16_ = auVar38;
    auVar64._16_16_ = auVar41;
    auVar64._0_16_ = auVar41;
    auVar65._16_16_ = auVar92;
    auVar65._0_16_ = auVar92;
    auVar69._16_16_ = auVar43;
    auVar69._0_16_ = auVar43;
    uVar89 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar70._4_4_ = uVar89;
    auVar70._0_4_ = uVar89;
    auVar70._8_4_ = uVar89;
    auVar70._12_4_ = uVar89;
    auVar70._16_4_ = uVar89;
    auVar70._20_4_ = uVar89;
    auVar70._24_4_ = uVar89;
    auVar70._28_4_ = uVar89;
    auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar89 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar93._4_4_ = uVar89;
    auVar93._0_4_ = uVar89;
    auVar93._8_4_ = uVar89;
    auVar93._12_4_ = uVar89;
    auVar93._16_4_ = uVar89;
    auVar93._20_4_ = uVar89;
    auVar93._24_4_ = uVar89;
    auVar93._28_4_ = uVar89;
    auVar66._16_16_ = auVar44;
    auVar66._0_16_ = auVar44;
    uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar95._4_4_ = uVar89;
    auVar95._0_4_ = uVar89;
    auVar95._8_4_ = uVar89;
    auVar95._12_4_ = uVar89;
    auVar95._16_4_ = uVar89;
    auVar95._20_4_ = uVar89;
    auVar95._24_4_ = uVar89;
    auVar95._28_4_ = uVar89;
    fVar101 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar98._4_4_ = fVar101;
    auVar98._0_4_ = fVar101;
    auVar98._8_4_ = fVar101;
    auVar98._12_4_ = fVar101;
    auVar98._16_4_ = fVar101;
    auVar98._20_4_ = fVar101;
    auVar98._24_4_ = fVar101;
    auVar98._28_4_ = fVar101;
    auVar57 = vsubps_avx(auVar78,auVar70);
    auVar60 = vsubps_avx512vl(auVar77,auVar58);
    auVar61 = vsubps_avx512vl(auVar79,auVar59);
    auVar62 = vsubps_avx512vl(auVar63,auVar70);
    auVar63 = vsubps_avx512vl(auVar68,auVar58);
    auVar64 = vsubps_avx512vl(auVar64,auVar59);
    auVar77 = vsubps_avx(auVar65,auVar70);
    auVar65 = vsubps_avx512vl(auVar69,auVar58);
    auVar66 = vsubps_avx512vl(auVar66,auVar59);
    auVar79 = vsubps_avx(auVar77,auVar57);
    auVar78 = vsubps_avx(auVar65,auVar60);
    auVar67 = vsubps_avx512vl(auVar66,auVar61);
    auVar68 = vsubps_avx512vl(auVar57,auVar62);
    auVar69 = vsubps_avx512vl(auVar60,auVar63);
    auVar70 = vsubps_avx512vl(auVar61,auVar64);
    auVar71 = vsubps_avx512vl(auVar62,auVar77);
    auVar72 = vsubps_avx512vl(auVar63,auVar65);
    auVar73 = vsubps_avx512vl(auVar64,auVar66);
    auVar75._0_4_ = auVar77._0_4_ + auVar57._0_4_;
    auVar75._4_4_ = auVar77._4_4_ + auVar57._4_4_;
    auVar75._8_4_ = auVar77._8_4_ + auVar57._8_4_;
    auVar75._12_4_ = auVar77._12_4_ + auVar57._12_4_;
    auVar75._16_4_ = auVar77._16_4_ + auVar57._16_4_;
    auVar75._20_4_ = auVar77._20_4_ + auVar57._20_4_;
    auVar75._24_4_ = auVar77._24_4_ + auVar57._24_4_;
    auVar75._28_4_ = auVar77._28_4_ + auVar57._28_4_;
    auVar96._0_4_ = auVar65._0_4_ + auVar60._0_4_;
    auVar96._4_4_ = auVar65._4_4_ + auVar60._4_4_;
    auVar96._8_4_ = auVar65._8_4_ + auVar60._8_4_;
    auVar96._12_4_ = auVar65._12_4_ + auVar60._12_4_;
    auVar96._16_4_ = auVar65._16_4_ + auVar60._16_4_;
    auVar96._20_4_ = auVar65._20_4_ + auVar60._20_4_;
    auVar96._24_4_ = auVar65._24_4_ + auVar60._24_4_;
    auVar96._28_4_ = auVar65._28_4_ + auVar60._28_4_;
    auVar58 = vaddps_avx512vl(auVar66,auVar61);
    auVar59 = vmulps_avx512vl(auVar96,auVar67);
    auVar59 = vfmsub231ps_avx512vl(auVar59,auVar78,auVar58);
    auVar58 = vmulps_avx512vl(auVar58,auVar79);
    auVar74 = vfmsub231ps_avx512vl(auVar58,auVar67,auVar75);
    auVar58._4_4_ = auVar78._4_4_ * auVar75._4_4_;
    auVar58._0_4_ = auVar78._0_4_ * auVar75._0_4_;
    auVar58._8_4_ = auVar78._8_4_ * auVar75._8_4_;
    auVar58._12_4_ = auVar78._12_4_ * auVar75._12_4_;
    auVar58._16_4_ = auVar78._16_4_ * auVar75._16_4_;
    auVar58._20_4_ = auVar78._20_4_ * auVar75._20_4_;
    auVar58._24_4_ = auVar78._24_4_ * auVar75._24_4_;
    auVar58._28_4_ = auVar75._28_4_;
    auVar38 = vfmsub231ps_fma(auVar58,auVar79,auVar96);
    auVar76._0_4_ = fVar101 * auVar38._0_4_;
    auVar76._4_4_ = fVar101 * auVar38._4_4_;
    auVar76._8_4_ = fVar101 * auVar38._8_4_;
    auVar76._12_4_ = fVar101 * auVar38._12_4_;
    auVar76._16_4_ = fVar101 * 0.0;
    auVar76._20_4_ = fVar101 * 0.0;
    auVar76._24_4_ = fVar101 * 0.0;
    auVar76._28_4_ = 0;
    auVar58 = vfmadd231ps_avx512vl(auVar76,auVar95,auVar74);
    auVar58 = vfmadd231ps_avx512vl(auVar58,auVar93,auVar59);
    auVar59 = vaddps_avx512vl(auVar57,auVar62);
    auVar74 = vaddps_avx512vl(auVar60,auVar63);
    auVar75 = vaddps_avx512vl(auVar61,auVar64);
    auVar76 = vmulps_avx512vl(auVar74,auVar70);
    auVar76 = vfmsub231ps_avx512vl(auVar76,auVar69,auVar75);
    auVar75 = vmulps_avx512vl(auVar75,auVar68);
    auVar75 = vfmsub231ps_avx512vl(auVar75,auVar70,auVar59);
    auVar59 = vmulps_avx512vl(auVar59,auVar69);
    auVar74 = vfmsub231ps_avx512vl(auVar59,auVar68,auVar74);
    auVar59._4_4_ = fVar101 * auVar74._4_4_;
    auVar59._0_4_ = fVar101 * auVar74._0_4_;
    auVar59._8_4_ = fVar101 * auVar74._8_4_;
    auVar59._12_4_ = fVar101 * auVar74._12_4_;
    auVar59._16_4_ = fVar101 * auVar74._16_4_;
    auVar59._20_4_ = fVar101 * auVar74._20_4_;
    auVar59._24_4_ = fVar101 * auVar74._24_4_;
    auVar59._28_4_ = auVar74._28_4_;
    auVar59 = vfmadd231ps_avx512vl(auVar59,auVar95,auVar75);
    local_1160 = vfmadd231ps_avx512vl(auVar59,auVar93,auVar76);
    auVar77 = vaddps_avx512vl(auVar62,auVar77);
    auVar59 = vaddps_avx512vl(auVar63,auVar65);
    auVar62 = vaddps_avx512vl(auVar64,auVar66);
    auVar63 = vmulps_avx512vl(auVar59,auVar73);
    auVar63 = vfmsub231ps_avx512vl(auVar63,auVar72,auVar62);
    auVar62 = vmulps_avx512vl(auVar62,auVar71);
    auVar64 = vfmsub231ps_avx512vl(auVar62,auVar73,auVar77);
    auVar62._4_4_ = auVar77._4_4_ * auVar72._4_4_;
    auVar62._0_4_ = auVar77._0_4_ * auVar72._0_4_;
    auVar62._8_4_ = auVar77._8_4_ * auVar72._8_4_;
    auVar62._12_4_ = auVar77._12_4_ * auVar72._12_4_;
    auVar62._16_4_ = auVar77._16_4_ * auVar72._16_4_;
    auVar62._20_4_ = auVar77._20_4_ * auVar72._20_4_;
    auVar62._24_4_ = auVar77._24_4_ * auVar72._24_4_;
    auVar62._28_4_ = auVar77._28_4_;
    auVar38 = vfmsub231ps_fma(auVar62,auVar71,auVar59);
    auVar77 = vmulps_avx512vl(auVar98,ZEXT1632(auVar38));
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar95,auVar64);
    auVar59 = vfmadd231ps_avx512vl(auVar77,auVar93,auVar63);
    auVar74._0_4_ = local_1160._0_4_ + auVar58._0_4_;
    auVar74._4_4_ = local_1160._4_4_ + auVar58._4_4_;
    auVar74._8_4_ = local_1160._8_4_ + auVar58._8_4_;
    auVar74._12_4_ = local_1160._12_4_ + auVar58._12_4_;
    auVar74._16_4_ = local_1160._16_4_ + auVar58._16_4_;
    auVar74._20_4_ = local_1160._20_4_ + auVar58._20_4_;
    auVar74._24_4_ = local_1160._24_4_ + auVar58._24_4_;
    auVar74._28_4_ = local_1160._28_4_ + auVar58._28_4_;
    local_1140 = vaddps_avx512vl(auVar59,auVar74);
    auVar64 = auVar112._0_32_;
    vandps_avx512vl(local_1140,auVar64);
    auVar77._8_4_ = 0x34000000;
    auVar77._0_8_ = 0x3400000034000000;
    auVar77._12_4_ = 0x34000000;
    auVar77._16_4_ = 0x34000000;
    auVar77._20_4_ = 0x34000000;
    auVar77._24_4_ = 0x34000000;
    auVar77._28_4_ = 0x34000000;
    auVar77 = vmulps_avx512vl(local_1140,auVar77);
    auVar62 = vminps_avx512vl(auVar58,local_1160);
    auVar62 = vminps_avx512vl(auVar62,auVar59);
    auVar63 = vxorps_avx512vl(auVar77,auVar113._0_32_);
    uVar15 = vcmpps_avx512vl(auVar62,auVar63,5);
    auVar62 = vmaxps_avx512vl(auVar58,local_1160);
    auVar59 = vmaxps_avx512vl(auVar62,auVar59);
    uVar16 = vcmpps_avx512vl(auVar59,auVar77,2);
    local_10c0 = (byte)uVar15 | (byte)uVar16;
    if (local_10c0 != 0) {
      auVar77 = vmulps_avx512vl(auVar67,auVar69);
      auVar59 = vmulps_avx512vl(auVar79,auVar70);
      auVar62 = vmulps_avx512vl(auVar78,auVar68);
      auVar63 = vmulps_avx512vl(auVar70,auVar72);
      auVar65 = vmulps_avx512vl(auVar68,auVar73);
      auVar66 = vmulps_avx512vl(auVar69,auVar71);
      auVar78 = vfmsub213ps_avx512vl(auVar78,auVar70,auVar77);
      auVar67 = vfmsub213ps_avx512vl(auVar67,auVar68,auVar59);
      auVar79 = vfmsub213ps_avx512vl(auVar79,auVar69,auVar62);
      auVar69 = vfmsub213ps_avx512vl(auVar73,auVar69,auVar63);
      auVar70 = vfmsub213ps_avx512vl(auVar71,auVar70,auVar65);
      auVar68 = vfmsub213ps_avx512vl(auVar72,auVar68,auVar66);
      vandps_avx512vl(auVar77,auVar64);
      vandps_avx512vl(auVar63,auVar64);
      uVar37 = vcmpps_avx512vl(auVar68,auVar68,1);
      vandps_avx512vl(auVar59,auVar64);
      vandps_avx512vl(auVar65,auVar64);
      uVar27 = vcmpps_avx512vl(auVar68,auVar68,1);
      vandps_avx512vl(auVar62,auVar64);
      vandps_avx512vl(auVar66,auVar64);
      uVar31 = vcmpps_avx512vl(auVar68,auVar68,1);
      bVar9 = (bool)((byte)uVar37 & 1);
      local_1120._0_4_ = (float)((uint)bVar9 * auVar78._0_4_ | (uint)!bVar9 * auVar69._0_4_);
      bVar9 = (bool)((byte)(uVar37 >> 1) & 1);
      local_1120._4_4_ = (float)((uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * auVar69._4_4_);
      bVar9 = (bool)((byte)(uVar37 >> 2) & 1);
      local_1120._8_4_ = (float)((uint)bVar9 * auVar78._8_4_ | (uint)!bVar9 * auVar69._8_4_);
      bVar9 = (bool)((byte)(uVar37 >> 3) & 1);
      local_1120._12_4_ = (float)((uint)bVar9 * auVar78._12_4_ | (uint)!bVar9 * auVar69._12_4_);
      bVar9 = (bool)((byte)(uVar37 >> 4) & 1);
      local_1120._16_4_ = (float)((uint)bVar9 * auVar78._16_4_ | (uint)!bVar9 * auVar69._16_4_);
      bVar9 = (bool)((byte)(uVar37 >> 5) & 1);
      local_1120._20_4_ = (float)((uint)bVar9 * auVar78._20_4_ | (uint)!bVar9 * auVar69._20_4_);
      bVar9 = (bool)((byte)(uVar37 >> 6) & 1);
      local_1120._24_4_ = (float)((uint)bVar9 * auVar78._24_4_ | (uint)!bVar9 * auVar69._24_4_);
      bVar9 = SUB81(uVar37 >> 7,0);
      local_1120._28_4_ = (uint)bVar9 * auVar78._28_4_ | (uint)!bVar9 * auVar69._28_4_;
      bVar9 = (bool)((byte)uVar27 & 1);
      local_1100._0_4_ = (float)((uint)bVar9 * auVar67._0_4_ | (uint)!bVar9 * auVar70._0_4_);
      bVar9 = (bool)((byte)(uVar27 >> 1) & 1);
      local_1100._4_4_ = (float)((uint)bVar9 * auVar67._4_4_ | (uint)!bVar9 * auVar70._4_4_);
      bVar9 = (bool)((byte)(uVar27 >> 2) & 1);
      local_1100._8_4_ = (float)((uint)bVar9 * auVar67._8_4_ | (uint)!bVar9 * auVar70._8_4_);
      bVar9 = (bool)((byte)(uVar27 >> 3) & 1);
      local_1100._12_4_ = (float)((uint)bVar9 * auVar67._12_4_ | (uint)!bVar9 * auVar70._12_4_);
      bVar9 = (bool)((byte)(uVar27 >> 4) & 1);
      local_1100._16_4_ = (float)((uint)bVar9 * auVar67._16_4_ | (uint)!bVar9 * auVar70._16_4_);
      bVar9 = (bool)((byte)(uVar27 >> 5) & 1);
      local_1100._20_4_ = (float)((uint)bVar9 * auVar67._20_4_ | (uint)!bVar9 * auVar70._20_4_);
      bVar9 = (bool)((byte)(uVar27 >> 6) & 1);
      local_1100._24_4_ = (float)((uint)bVar9 * auVar67._24_4_ | (uint)!bVar9 * auVar70._24_4_);
      bVar9 = SUB81(uVar27 >> 7,0);
      local_1100._28_4_ = (uint)bVar9 * auVar67._28_4_ | (uint)!bVar9 * auVar70._28_4_;
      bVar9 = (bool)((byte)uVar31 & 1);
      local_10e0 = (float)((uint)bVar9 * auVar79._0_4_ | (uint)!bVar9 * auVar68._0_4_);
      bVar9 = (bool)((byte)(uVar31 >> 1) & 1);
      fStack_10dc = (float)((uint)bVar9 * auVar79._4_4_ | (uint)!bVar9 * auVar68._4_4_);
      bVar9 = (bool)((byte)(uVar31 >> 2) & 1);
      fStack_10d8 = (float)((uint)bVar9 * auVar79._8_4_ | (uint)!bVar9 * auVar68._8_4_);
      bVar9 = (bool)((byte)(uVar31 >> 3) & 1);
      fStack_10d4 = (float)((uint)bVar9 * auVar79._12_4_ | (uint)!bVar9 * auVar68._12_4_);
      bVar9 = (bool)((byte)(uVar31 >> 4) & 1);
      fStack_10d0 = (float)((uint)bVar9 * auVar79._16_4_ | (uint)!bVar9 * auVar68._16_4_);
      bVar9 = (bool)((byte)(uVar31 >> 5) & 1);
      fStack_10cc = (float)((uint)bVar9 * auVar79._20_4_ | (uint)!bVar9 * auVar68._20_4_);
      bVar9 = (bool)((byte)(uVar31 >> 6) & 1);
      fStack_10c8 = (float)((uint)bVar9 * auVar79._24_4_ | (uint)!bVar9 * auVar68._24_4_);
      bVar9 = SUB81(uVar31 >> 7,0);
      uStack_10c4 = (uint)bVar9 * auVar79._28_4_ | (uint)!bVar9 * auVar68._28_4_;
      auVar71._4_4_ = fVar101 * fStack_10dc;
      auVar71._0_4_ = fVar101 * local_10e0;
      auVar71._8_4_ = fVar101 * fStack_10d8;
      auVar71._12_4_ = fVar101 * fStack_10d4;
      auVar71._16_4_ = fVar101 * fStack_10d0;
      auVar71._20_4_ = fVar101 * fStack_10cc;
      auVar71._24_4_ = fVar101 * fStack_10c8;
      auVar71._28_4_ = fVar101;
      auVar38 = vfmadd213ps_fma(auVar95,local_1100,auVar71);
      auVar38 = vfmadd213ps_fma(auVar93,local_1120,ZEXT1632(auVar38));
      auVar79 = ZEXT1632(CONCAT412(auVar38._12_4_ + auVar38._12_4_,
                                   CONCAT48(auVar38._8_4_ + auVar38._8_4_,
                                            CONCAT44(auVar38._4_4_ + auVar38._4_4_,
                                                     auVar38._0_4_ + auVar38._0_4_))));
      auVar72._0_4_ = auVar61._0_4_ * local_10e0;
      auVar72._4_4_ = auVar61._4_4_ * fStack_10dc;
      auVar72._8_4_ = auVar61._8_4_ * fStack_10d8;
      auVar72._12_4_ = auVar61._12_4_ * fStack_10d4;
      auVar72._16_4_ = auVar61._16_4_ * fStack_10d0;
      auVar72._20_4_ = auVar61._20_4_ * fStack_10cc;
      auVar72._24_4_ = auVar61._24_4_ * fStack_10c8;
      auVar72._28_4_ = 0;
      auVar38 = vfmadd213ps_fma(auVar60,local_1100,auVar72);
      auVar43 = vfmadd213ps_fma(auVar57,local_1120,ZEXT1632(auVar38));
      auVar57 = vrcp14ps_avx512vl(auVar79);
      auVar59 = auVar114._0_32_;
      auVar77 = vfnmadd213ps_avx512vl(auVar57,auVar79,auVar59);
      auVar38 = vfmadd132ps_fma(auVar77,auVar57,auVar57);
      local_1060 = ZEXT1632(CONCAT412((auVar43._12_4_ + auVar43._12_4_) * auVar38._12_4_,
                                      CONCAT48((auVar43._8_4_ + auVar43._8_4_) * auVar38._8_4_,
                                               CONCAT44((auVar43._4_4_ + auVar43._4_4_) *
                                                        auVar38._4_4_,
                                                        (auVar43._0_4_ + auVar43._0_4_) *
                                                        auVar38._0_4_))));
      auVar83 = ZEXT3264(local_1060);
      uVar89 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar57._4_4_ = uVar89;
      auVar57._0_4_ = uVar89;
      auVar57._8_4_ = uVar89;
      auVar57._12_4_ = uVar89;
      auVar57._16_4_ = uVar89;
      auVar57._20_4_ = uVar89;
      auVar57._24_4_ = uVar89;
      auVar57._28_4_ = uVar89;
      uVar15 = vcmpps_avx512vl(local_1060,auVar57,0xd);
      auVar57 = vxorps_avx512vl(auVar79,auVar113._0_32_);
      fVar101 = (ray->super_RayK<1>).tfar;
      auVar78._4_4_ = fVar101;
      auVar78._0_4_ = fVar101;
      auVar78._8_4_ = fVar101;
      auVar78._12_4_ = fVar101;
      auVar78._16_4_ = fVar101;
      auVar78._20_4_ = fVar101;
      auVar78._24_4_ = fVar101;
      auVar78._28_4_ = fVar101;
      uVar16 = vcmpps_avx512vl(local_1060,auVar78,2);
      uVar17 = vcmpps_avx512vl(auVar79,auVar57,4);
      local_10c0 = (byte)uVar15 & (byte)uVar16 & (byte)uVar17 & local_10c0;
      uVar29 = (uint)local_10c0;
      if (local_10c0 != 0) {
        local_11c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        uVar33 = vextractps_avx(local_11c0._0_16_,1);
        local_1180 = auVar58;
        local_fe0 = 0xf0;
        auVar73._8_4_ = 0x219392ef;
        auVar73._0_8_ = 0x219392ef219392ef;
        auVar73._12_4_ = 0x219392ef;
        auVar73._16_4_ = 0x219392ef;
        auVar73._20_4_ = 0x219392ef;
        auVar73._24_4_ = 0x219392ef;
        auVar73._28_4_ = 0x219392ef;
        uVar37 = vcmpps_avx512vl(local_1140,auVar73,5);
        auVar57 = vrcp14ps_avx512vl(local_1140);
        auVar77 = vfnmadd213ps_avx512vl(local_1140,auVar57,auVar59);
        auVar77 = vfmadd132ps_avx512vl(auVar77,auVar57,auVar57);
        fVar102 = (float)((uint)((byte)uVar37 & 1) * auVar77._0_4_);
        fVar101 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar77._4_4_);
        fVar108 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar77._8_4_);
        fVar107 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar77._12_4_);
        fVar106 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar77._16_4_);
        fVar91 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar77._20_4_);
        fVar103 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar77._24_4_);
        auVar21._4_4_ = fVar101 * auVar58._4_4_;
        auVar21._0_4_ = fVar102 * auVar58._0_4_;
        auVar21._8_4_ = fVar108 * auVar58._8_4_;
        auVar21._12_4_ = fVar107 * auVar58._12_4_;
        auVar21._16_4_ = fVar106 * auVar58._16_4_;
        auVar21._20_4_ = fVar91 * auVar58._20_4_;
        auVar21._24_4_ = fVar103 * auVar58._24_4_;
        auVar21._28_4_ = auVar58._28_4_;
        auVar77 = vminps_avx512vl(auVar21,auVar59);
        auVar22._4_4_ = local_1160._4_4_ * fVar101;
        auVar22._0_4_ = local_1160._0_4_ * fVar102;
        auVar22._8_4_ = local_1160._8_4_ * fVar108;
        auVar22._12_4_ = local_1160._12_4_ * fVar107;
        auVar22._16_4_ = local_1160._16_4_ * fVar106;
        auVar22._20_4_ = local_1160._20_4_ * fVar91;
        auVar22._24_4_ = local_1160._24_4_ * fVar103;
        auVar22._28_4_ = auVar57._28_4_;
        auVar57 = vminps_avx512vl(auVar22,auVar59);
        auVar79 = vsubps_avx512vl(auVar59,auVar77);
        auVar78 = vsubps_avx512vl(auVar59,auVar57);
        local_1080 = vblendps_avx(auVar57,auVar79,0xf0);
        local_10a0 = vblendps_avx(auVar77,auVar78,0xf0);
        fVar101 = (float)DAT_01fef940;
        fVar102 = DAT_01fef940._4_4_;
        fVar103 = DAT_01fef940._8_4_;
        fVar91 = DAT_01fef940._12_4_;
        fVar106 = DAT_01fef940._16_4_;
        fVar107 = DAT_01fef940._20_4_;
        fVar108 = DAT_01fef940._24_4_;
        local_1040[0] = local_1120._0_4_ * fVar101;
        local_1040[1] = local_1120._4_4_ * fVar102;
        local_1040[2] = local_1120._8_4_ * fVar103;
        local_1040[3] = local_1120._12_4_ * fVar91;
        fStack_1030 = local_1120._16_4_ * fVar106;
        fStack_102c = local_1120._20_4_ * fVar107;
        fStack_1028 = local_1120._24_4_ * fVar108;
        uStack_1024 = local_1120._28_4_;
        local_1020[0] = local_1100._0_4_ * fVar101;
        local_1020[1] = local_1100._4_4_ * fVar102;
        local_1020[2] = local_1100._8_4_ * fVar103;
        local_1020[3] = local_1100._12_4_ * fVar91;
        fStack_1010 = local_1100._16_4_ * fVar106;
        fStack_100c = local_1100._20_4_ * fVar107;
        fStack_1008 = local_1100._24_4_ * fVar108;
        uStack_1004 = local_1100._28_4_;
        local_1000[0] = local_10e0 * fVar101;
        local_1000[1] = fStack_10dc * fVar102;
        local_1000[2] = fStack_10d8 * fVar103;
        local_1000[3] = fStack_10d4 * fVar91;
        fStack_ff0 = fStack_10d0 * fVar106;
        fStack_fec = fStack_10cc * fVar107;
        fStack_fe8 = fStack_10c8 * fVar108;
        uStack_fe4 = uStack_10c4;
        auVar82._8_4_ = 0x7f800000;
        auVar82._0_8_ = 0x7f8000007f800000;
        auVar82._12_4_ = 0x7f800000;
        auVar82._16_4_ = 0x7f800000;
        auVar82._20_4_ = 0x7f800000;
        auVar82._24_4_ = 0x7f800000;
        auVar82._28_4_ = 0x7f800000;
        auVar57 = vblendmps_avx512vl(auVar82,local_1060);
        auVar80._0_4_ =
             (uint)(local_10c0 & 1) * auVar57._0_4_ | (uint)!(bool)(local_10c0 & 1) * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 1 & 1);
        auVar80._4_4_ = (uint)bVar9 * auVar57._4_4_ | (uint)!bVar9 * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 2 & 1);
        auVar80._8_4_ = (uint)bVar9 * auVar57._8_4_ | (uint)!bVar9 * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 3 & 1);
        auVar80._12_4_ = (uint)bVar9 * auVar57._12_4_ | (uint)!bVar9 * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 4 & 1);
        auVar80._16_4_ = (uint)bVar9 * auVar57._16_4_ | (uint)!bVar9 * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 5 & 1);
        auVar80._20_4_ = (uint)bVar9 * auVar57._20_4_ | (uint)!bVar9 * 0x7f800000;
        bVar9 = (bool)(local_10c0 >> 6 & 1);
        auVar80._24_4_ = (uint)bVar9 * auVar57._24_4_ | (uint)!bVar9 * 0x7f800000;
        auVar80._28_4_ =
             (uint)(local_10c0 >> 7) * auVar57._28_4_ | (uint)!(bool)(local_10c0 >> 7) * 0x7f800000;
        auVar57 = vshufps_avx(auVar80,auVar80,0xb1);
        auVar57 = vminps_avx(auVar80,auVar57);
        auVar77 = vshufpd_avx(auVar57,auVar57,5);
        auVar57 = vminps_avx(auVar57,auVar77);
        auVar77 = vpermpd_avx2(auVar57,0x4e);
        auVar57 = vminps_avx(auVar57,auVar77);
        uVar15 = vcmpps_avx512vl(auVar80,auVar57,0);
        bVar23 = local_10c0;
        if (((byte)uVar15 & local_10c0) != 0) {
          bVar23 = (byte)uVar15 & local_10c0;
        }
        do {
          local_1280 = auVar83._0_32_;
          uVar18 = 0;
          for (uVar24 = (uint)bVar23; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
            uVar18 = uVar18 + 1;
          }
          uVar24 = *(uint *)((long)&local_fc0 + (ulong)uVar18 * 4);
          pGVar8 = (pSVar2->geometries).items[uVar24].ptr;
          if ((pGVar8->mask & uVar33) == 0) {
            uVar29 = (uint)(byte)(~(byte)(1 << (uVar18 & 0x1f)) & (byte)uVar29);
          }
          else {
            pRVar34 = context->args;
            if (pRVar34->filter == (RTCFilterFunctionN)0x0) {
              pRVar28 = context->user;
              if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar37 = (ulong)(uVar18 << 2);
                fVar101 = *(float *)(local_10a0 + uVar37);
                fVar102 = *(float *)(local_1080 + uVar37);
                (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar37);
                (ray->Ng).field_0.field_0.x = *(float *)((long)local_1040 + uVar37);
                (ray->Ng).field_0.field_0.y = *(float *)((long)local_1020 + uVar37);
                (ray->Ng).field_0.field_0.z = *(float *)((long)local_1000 + uVar37);
                ray->u = fVar101;
                ray->v = fVar102;
                ray->primID = *(uint *)((long)&local_11a0 + uVar37);
                ray->geomID = uVar24;
                ray->instID[0] = pRVar28->instID[0];
                ray->instPrimID[0] = pRVar28->instPrimID[0];
                break;
              }
            }
            else {
              pRVar28 = context->user;
            }
            uVar37 = (ulong)(uVar18 * 4);
            local_12b0 = *(float *)((long)local_1040 + uVar37);
            local_12ac = *(undefined4 *)((long)local_1020 + uVar37);
            local_12a8 = *(undefined4 *)((long)local_1000 + uVar37);
            local_12a4 = *(undefined4 *)(local_10a0 + uVar37);
            local_12a0 = *(undefined4 *)(local_1080 + uVar37);
            local_129c = *(undefined4 *)((long)&local_11a0 + uVar37);
            local_1298 = uVar24;
            local_1294 = pRVar28->instID[0];
            local_1290 = pRVar28->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_1060 + uVar37);
            local_1304 = -1;
            local_1300.valid = &local_1304;
            local_1300.geometryUserPtr = pGVar8->userPtr;
            local_1300.context = pRVar28;
            local_1300.ray = (RTCRayN *)ray;
            local_1300.hit = (RTCHitN *)&local_12b0;
            local_1300.N = 1;
            if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01eaddbd:
              if ((pRVar34->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                (*pRVar34->filter)(&local_1300);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar114 = ZEXT3264(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar113 = ZEXT3264(auVar57);
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar112 = ZEXT3264(auVar57);
                if (*local_1300.valid == 0) goto LAB_01eade7e;
              }
              (((Vec3f *)((long)local_1300.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_1300.hit;
              (((Vec3f *)((long)local_1300.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_1300.hit + 4);
              (((Vec3f *)((long)local_1300.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_1300.hit + 8);
              *(float *)((long)local_1300.ray + 0x3c) = *(float *)(local_1300.hit + 0xc);
              *(float *)((long)local_1300.ray + 0x40) = *(float *)(local_1300.hit + 0x10);
              *(float *)((long)local_1300.ray + 0x44) = *(float *)(local_1300.hit + 0x14);
              *(float *)((long)local_1300.ray + 0x48) = *(float *)(local_1300.hit + 0x18);
              *(float *)((long)local_1300.ray + 0x4c) = *(float *)(local_1300.hit + 0x1c);
              *(float *)((long)local_1300.ray + 0x50) = *(float *)(local_1300.hit + 0x20);
            }
            else {
              local_12d0 = pRVar34;
              (*pGVar8->intersectionFilterN)(&local_1300);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar114 = ZEXT3264(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar113 = ZEXT3264(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar112 = ZEXT3264(auVar57);
              pRVar34 = local_12d0;
              if (*local_1300.valid != 0) goto LAB_01eaddbd;
LAB_01eade7e:
              (ray->super_RayK<1>).tfar = (float)local_11c0._0_4_;
            }
            fVar101 = (ray->super_RayK<1>).tfar;
            auVar20._4_4_ = fVar101;
            auVar20._0_4_ = fVar101;
            auVar20._8_4_ = fVar101;
            auVar20._12_4_ = fVar101;
            auVar20._16_4_ = fVar101;
            auVar20._20_4_ = fVar101;
            auVar20._24_4_ = fVar101;
            auVar20._28_4_ = fVar101;
            uVar15 = vcmpps_avx512vl(local_1280,auVar20,2);
            uVar29 = (uint)(byte)(~(byte)(1 << (uVar18 & 0x1f)) & (byte)uVar29) & (uint)uVar15;
            uVar33 = (ray->super_RayK<1>).mask;
            local_11c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
          }
          if ((char)uVar29 == '\0') break;
          BVHNIntersector1<4,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,true>>>
          ::intersect();
          auVar83 = ZEXT3264(local_1280);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar114 = ZEXT3264(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar113 = ZEXT3264(auVar57);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar112 = ZEXT3264(auVar57);
          bVar23 = (byte)local_1300.valid;
        } while( true );
      }
    }
    local_12c0 = local_12c0 + 1;
  } while (local_12c0 != local_12c8);
LAB_01eadf63:
  fVar101 = (ray->super_RayK<1>).tfar;
  auVar83 = ZEXT1664(CONCAT412(fVar101,CONCAT48(fVar101,CONCAT44(fVar101,fVar101))));
  auVar97 = ZEXT1664(local_11d0);
  auVar99 = ZEXT1664(local_11e0);
  auVar100 = ZEXT1664(local_11f0);
  auVar104 = ZEXT1664(local_1210);
  auVar105 = ZEXT1664(local_1220);
  auVar109 = ZEXT1664(local_1240);
  auVar110 = ZEXT1664(local_1250);
  auVar111 = ZEXT1664(local_1260);
  fVar91 = local_1200;
  fVar101 = fStack_11fc;
  fVar102 = fStack_11f8;
  fVar103 = fStack_11f4;
  fVar81 = local_1230;
  fVar106 = fStack_122c;
  fVar107 = fStack_1228;
  fVar108 = fStack_1224;
LAB_01eadfc0:
  if (puVar25 == &local_fa0) {
    return;
  }
  goto LAB_01ead31f;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }